

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int inter_mode_compatible_skip
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,PREDICTION_MODE curr_mode,
              MV_REFERENCE_FRAME *ref_frames)

{
  int iVar1;
  PREDICTION_MODE in_CL;
  BLOCK_SIZE in_DL;
  long in_RSI;
  long in_RDI;
  char *in_R8;
  uchar segment_id;
  segmentation *seg;
  CurrentFrame *current_frame;
  AV1_COMMON *cm;
  int comp_pred;
  
  if ('\0' < in_R8[1]) {
    iVar1 = is_comp_ref_allowed(in_DL);
    if (iVar1 == 0) {
      return 1;
    }
    if ((*(uint *)(in_RDI + 0x608b8) & (uint)""[in_R8[1]]) == 0) {
      return 1;
    }
    iVar1 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
    if (iVar1 != 0) {
      return 1;
    }
    if (*(char *)(in_RDI + 0x3bf81) == '\0') {
      return 1;
    }
    iVar1 = segfeature_active((segmentation *)(in_RDI + 0x409b8),
                              (byte)*(undefined2 *)(**(long **)(in_RSI + 0x2058) + 0xa7) & 7,'\x05')
    ;
    if (iVar1 != 0) {
      return 1;
    }
  }
  if (('\0' < *in_R8) && (in_R8[1] == '\0')) {
    iVar1 = is_interintra_allowed_bsize(in_DL);
    if (iVar1 == 0) {
      return 1;
    }
    iVar1 = is_interintra_allowed_mode(in_CL);
    if (iVar1 == 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int inter_mode_compatible_skip(const AV1_COMP *cpi, const MACROBLOCK *x,
                                      BLOCK_SIZE bsize,
                                      PREDICTION_MODE curr_mode,
                                      const MV_REFERENCE_FRAME *ref_frames) {
  const int comp_pred = ref_frames[1] > INTRA_FRAME;
  if (comp_pred) {
    if (!is_comp_ref_allowed(bsize)) return 1;
    if (!(cpi->ref_frame_flags & av1_ref_frame_flag_list[ref_frames[1]])) {
      return 1;
    }

    const AV1_COMMON *const cm = &cpi->common;
    if (frame_is_intra_only(cm)) return 1;

    const CurrentFrame *const current_frame = &cm->current_frame;
    if (current_frame->reference_mode == SINGLE_REFERENCE) return 1;

    const struct segmentation *const seg = &cm->seg;
    const unsigned char segment_id = x->e_mbd.mi[0]->segment_id;
    // Do not allow compound prediction if the segment level reference frame
    // feature is in use as in this case there can only be one reference.
    if (segfeature_active(seg, segment_id, SEG_LVL_REF_FRAME)) return 1;
  }

  if (ref_frames[0] > INTRA_FRAME && ref_frames[1] == INTRA_FRAME) {
    // Mode must be compatible
    if (!is_interintra_allowed_bsize(bsize)) return 1;
    if (!is_interintra_allowed_mode(curr_mode)) return 1;
  }

  return 0;
}